

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeViewPrivate::calcLogicalIndices
          (QTreeViewPrivate *this,QList<int> *logicalIndices,
          QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,int left,int right)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int logicalIndex;
  int iVar6;
  int iVar7;
  pointer pVVar8;
  int visualIndex;
  ulong uVar9;
  int iVar10;
  ViewItemPosition VVar11;
  int local_50;
  
  iVar5 = QHeaderView::count(this->header);
  iVar10 = left;
  do {
    if (iVar10 < 1) {
      logicalIndex = -1;
      break;
    }
    iVar10 = iVar10 + -1;
    logicalIndex = QHeaderView::logicalIndex(this->header,iVar10);
    bVar4 = QHeaderView::isSectionHidden(this->header,logicalIndex);
  } while (bVar4);
  do {
    local_50 = -1;
    if (iVar5 <= left) {
LAB_0054246f:
      QList<QStyleOptionViewItem::ViewItemPosition>::resize(itemPositions,(logicalIndices->d).size);
      uVar9 = 0;
      while (uVar2 = (logicalIndices->d).size, uVar9 < uVar2) {
        piVar3 = (logicalIndices->d).ptr;
        iVar10 = local_50;
        if (uVar9 + 1 < uVar2) {
          iVar10 = piVar3[uVar9 + 1];
        }
        iVar6 = logicalIndex;
        if (uVar9 != 0) {
          iVar6 = piVar3[uVar9 - 1];
        }
        VVar11 = OnlyOne;
        if ((((iVar5 != 1) && ((iVar1 = piVar3[uVar9], iVar10 != 0 || (iVar6 != -1)))) &&
            ((iVar1 != 0 || (iVar10 != -1)))) && (this->spanning == false)) {
          iVar7 = logicalIndexForTree(this);
          VVar11 = Beginning;
          if ((iVar7 != iVar1) && (iVar10 == 0 || iVar6 != -1)) {
            VVar11 = (iVar10 + 1U < 2) + Middle;
          }
        }
        pVVar8 = QList<QStyleOptionViewItem::ViewItemPosition>::data(itemPositions);
        pVVar8[uVar9] = VVar11;
        uVar9 = uVar9 + 1;
      }
      return;
    }
    local_50 = QHeaderView::logicalIndex(this->header,left);
    bVar4 = QHeaderView::isSectionHidden(this->header,local_50);
    if (!bVar4) {
      if (right < left) goto LAB_0054246f;
      QList<int>::append(logicalIndices,local_50);
    }
    left = left + 1;
  } while( true );
}

Assistant:

void QTreeViewPrivate::calcLogicalIndices(
        QList<int> *logicalIndices, QList<QStyleOptionViewItem::ViewItemPosition> *itemPositions,
        int left, int right) const
{
    const int columnCount = header->count();
    /* 'left' and 'right' are the left-most and right-most visible visual indices.
       Compute the first visible logical indices before and after the left and right.
       We will use these values to determine the QStyleOptionViewItem::viewItemPosition. */
    int logicalIndexBeforeLeft = -1, logicalIndexAfterRight = -1;
    for (int visualIndex = left - 1; visualIndex >= 0; --visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            logicalIndexBeforeLeft = logicalIndex;
            break;
        }
    }

    for (int visualIndex = left; visualIndex < columnCount; ++visualIndex) {
        int logicalIndex = header->logicalIndex(visualIndex);
        if (!header->isSectionHidden(logicalIndex)) {
            if (visualIndex > right) {
                logicalIndexAfterRight = logicalIndex;
                break;
            }
            logicalIndices->append(logicalIndex);
        }
    }

    itemPositions->resize(logicalIndices->size());
    for (int currentLogicalSection = 0; currentLogicalSection < logicalIndices->size(); ++currentLogicalSection) {
        const int headerSection = logicalIndices->at(currentLogicalSection);
        // determine the viewItemPosition depending on the position of column 0
        int nextLogicalSection = currentLogicalSection + 1 >= logicalIndices->size()
                                 ? logicalIndexAfterRight
                                 : logicalIndices->at(currentLogicalSection + 1);
        int prevLogicalSection = currentLogicalSection - 1 < 0
                                 ? logicalIndexBeforeLeft
                                 : logicalIndices->at(currentLogicalSection - 1);
        QStyleOptionViewItem::ViewItemPosition pos;
        if (columnCount == 1 || (nextLogicalSection == 0 && prevLogicalSection == -1)
            || (headerSection == 0 && nextLogicalSection == -1) || spanning)
            pos = QStyleOptionViewItem::OnlyOne;
        else if (isTreePosition(headerSection) || (nextLogicalSection != 0 && prevLogicalSection == -1))
            pos = QStyleOptionViewItem::Beginning;
        else if (nextLogicalSection == 0 || nextLogicalSection == -1)
            pos = QStyleOptionViewItem::End;
        else
            pos = QStyleOptionViewItem::Middle;
        (*itemPositions)[currentLogicalSection] = pos;
    }
}